

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

bool __thiscall
chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
          (ChArchiveExplorer *this,myEmployee *val,myEmployeeBoss *root,string *property_name)

{
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  myEmployee *pmVar4;
  myEmployee *valptr;
  ChNameValue<myEmployeeBoss> local_48;
  string *local_30;
  string *property_name_local;
  myEmployeeBoss *root_local;
  myEmployee *val_local;
  ChArchiveExplorer *this_local;
  
  local_30 = property_name;
  property_name_local = (string *)root;
  root_local = (myEmployeeBoss *)val;
  val_local = (myEmployee *)this;
  PrepareSearch(this,property_name);
  make_ChNameValue<myEmployeeBoss>(&local_48,"root",(myEmployeeBoss *)property_name_local,"",'\0');
  ChArchiveOut::operator<<(&this->super_ChArchiveOut,&local_48);
  ChNameValue<myEmployeeBoss>::~ChNameValue(&local_48);
  if ((this->found & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    ppCVar3 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::operator[]
                        (&this->results,0);
    iVar2 = (*(*ppCVar3)->_vptr_ChValue[6])();
    bVar1 = std::type_info::operator==
                      ((type_info *)CONCAT44(extraout_var,iVar2),(type_info *)&myEmployee::typeinfo)
    ;
    if (bVar1) {
      ppCVar3 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::operator[]
                          (&this->results,0);
      iVar2 = (*(*ppCVar3)->_vptr_ChValue[0xc])();
      myEmployee::operator=
                (&root_local->super_myEmployee,(myEmployee *)CONCAT44(extraout_var_00,iVar2));
      this_local._7_1_ = true;
    }
    else {
      ppCVar3 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::operator[]
                          (&this->results,0);
      pmVar4 = ChValue::PointerUpCast<myEmployee>(*ppCVar3);
      if (pmVar4 == (myEmployee *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        myEmployee::operator=(&root_local->super_myEmployee,pmVar4);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FetchValue(P& val, const T& root, const std::string& property_name) {

          this->PrepareSearch(property_name);
          
          this->operator<<( CHNVP(root,"") ); // SCAN! 

          if (found) {
              if (*this->results[0]->GetTypeid() == typeid(P)) { 
                  val = *(static_cast<P*> (this->results[0]->GetRawPtr()));
                  return true;
              }
              else if (P* valptr = this->results[0]->PointerUpCast<P>()) {
                  val = *valptr;
                  return true;
              } else
                  return false;
          }
          else
              return false;
      }